

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O2

void CheckNinjaVersion(string *version)

{
  int iVar1;
  bool bVar2;
  int file_minor;
  int bin_minor;
  int bin_major;
  int file_major;
  int local_3c;
  int local_38;
  int local_34;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,kNinjaVersion,(allocator<char> *)&local_3c);
  ParseVersion(&local_30,&local_34,&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  ParseVersion(version,(int *)&local_30,&local_3c);
  bVar2 = SBORROW4(local_34,(int)local_30._M_dataplus._M_p);
  iVar1 = local_34 - (int)local_30._M_dataplus._M_p;
  if ((int)local_30._M_dataplus._M_p < local_34) {
    Warning("ninja executable version (%s) greater than build file ninja_required_version (%s); versions may be incompatible."
            ,kNinjaVersion,(version->_M_dataplus)._M_p);
  }
  else {
    if (local_34 == (int)local_30._M_dataplus._M_p) {
      bVar2 = SBORROW4(local_38,local_3c);
      iVar1 = local_38 - local_3c;
    }
    if (bVar2 != iVar1 < 0) {
      Fatal("ninja version (%s) incompatible with build file ninja_required_version version (%s).",
            kNinjaVersion,(version->_M_dataplus)._M_p);
    }
  }
  return;
}

Assistant:

void CheckNinjaVersion(const string& version) {
  int bin_major, bin_minor;
  ParseVersion(kNinjaVersion, &bin_major, &bin_minor);
  int file_major, file_minor;
  ParseVersion(version, &file_major, &file_minor);

  if (bin_major > file_major) {
    Warning("ninja executable version (%s) greater than build file "
            "ninja_required_version (%s); versions may be incompatible.",
            kNinjaVersion, version.c_str());
    return;
  }

  if ((bin_major == file_major && bin_minor < file_minor) ||
      bin_major < file_major) {
    Fatal("ninja version (%s) incompatible with build file "
          "ninja_required_version version (%s).",
          kNinjaVersion, version.c_str());
  }
}